

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsprg.cpp
# Opt level: O0

CTPNStmTop * __thiscall CTcParser::parse_intrinsic_class(CTcParser *this,int *err)

{
  tc_toktyp_t tVar1;
  tc_symtype_t tVar2;
  int iVar3;
  CTcToken *pCVar4;
  CTcSymMetaclassBase *pCVar5;
  size_t sVar6;
  char *pcVar7;
  CTcSymMetaclass *sc;
  CTcTokenizer *in_RSI;
  long in_RDI;
  int *unaff_retaddr;
  int *in_stack_00000008;
  int *in_stack_00000010;
  int in_stack_00000018;
  int in_stack_0000001c;
  CTcParser *in_stack_00000020;
  int *in_stack_00000030;
  CTcSymLocal **in_stack_00000038;
  int *in_stack_00000040;
  int in_stack_00000048;
  int in_stack_00000050;
  CTcFormalTypeList **in_stack_00000058;
  CTcSymLocal *varargs_list_local;
  int varargs_list;
  int varargs;
  int opt_argc;
  int argc;
  int is_static;
  CTcToken prop_tok;
  CTcSymMetaclass *sc_meta_sym;
  CTcSymMetaclass *table_sym;
  CTcSymMetaclass *meta_sym;
  CTcToken meta_tok;
  int got_name_tok;
  int list_done;
  int meta_id;
  textchar_t *in_stack_fffffffffffffe98;
  CTcTokenizer *in_stack_fffffffffffffea0;
  CTcTokenizer *in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  CTcSymMetaclass *in_stack_fffffffffffffec0;
  CTcGenTarg *in_stack_fffffffffffffec8;
  uint in_stack_fffffffffffffef4;
  CTcGenTarg *in_stack_fffffffffffffef8;
  char *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  tctarg_obj_id_t in_stack_ffffffffffffff0c;
  CTcSymMetaclassBase *in_stack_ffffffffffffff10;
  undefined1 local_c0 [68];
  CTcSymMetaclassBase *local_58;
  int local_24;
  int local_20;
  int local_1c;
  CTcTokenizer *local_18;
  
  local_24 = 0;
  local_18 = in_RSI;
  CTcToken::CTcToken((CTcToken *)&stack0xffffffffffffffb0);
  local_58 = (CTcSymMetaclassBase *)0x0;
  tVar1 = CTcTokenizer::next(in_stack_fffffffffffffea8);
  if (tVar1 == TOKT_SYM) {
    pCVar4 = CTcTokenizer::copycur
                       ((CTcTokenizer *)
                        CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    memcpy(&stack0xffffffffffffffb0,pCVar4,0x21);
    CTcToken::get_text((CTcToken *)&stack0xffffffffffffffb0);
    CTcToken::get_text_len((CTcToken *)&stack0xffffffffffffffb0);
    local_58 = (CTcSymMetaclassBase *)
               CTcPrsSymtab::find((CTcPrsSymtab *)in_stack_fffffffffffffea0,
                                  in_stack_fffffffffffffe98,0x21b368);
    if ((local_58 == (CTcSymMetaclassBase *)0x0) ||
       ((tVar2 = CTcSymbolBase::get_type((CTcSymbolBase *)local_58), tVar2 == TC_SYM_METACLASS &&
        (iVar3 = CTcSymMetaclassBase::is_ext(local_58), iVar3 != 0)))) {
      local_24 = 1;
    }
    else {
      CTcTokenizer::log_error_curtok
                (in_stack_fffffffffffffea0,(int)((ulong)in_stack_fffffffffffffe98 >> 0x20));
      local_58 = (CTcSymMetaclassBase *)0x0;
    }
    CTcTokenizer::next(in_stack_fffffffffffffea8);
  }
  else {
    CTcTokenizer::log_error_curtok
              (in_stack_fffffffffffffea0,(int)((ulong)in_stack_fffffffffffffe98 >> 0x20));
  }
  tVar1 = CTcTokenizer::cur((CTcTokenizer *)0x21b400);
  if (tVar1 == TOKT_SSTR) {
    if (local_24 != 0) {
      if (local_58 == (CTcSymMetaclassBase *)0x0) {
        local_58 = (CTcSymMetaclassBase *)CTcSymbolBase::operator_new(0x21b430);
        CTcToken::get_text((CTcToken *)&stack0xffffffffffffffb0);
        in_stack_ffffffffffffff10 =
             (CTcSymMetaclassBase *)CTcToken::get_text_len((CTcToken *)&stack0xffffffffffffffb0);
        in_stack_ffffffffffffff0c = CTcGenTarg::new_obj_id(G_cg);
        CTcSymMetaclass::CTcSymMetaclass
                  (in_stack_fffffffffffffec0,
                   (char *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                   CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                   (int)((ulong)in_stack_fffffffffffffea8 >> 0x20),(int)in_stack_fffffffffffffea8,
                   (tctarg_obj_id_t)((ulong)in_stack_fffffffffffffea0 >> 0x20));
        (**(code **)(**(long **)(in_RDI + 0x80) + 0x18))(*(long **)(in_RDI + 0x80),local_58);
      }
      else {
        CTcSymMetaclassBase::set_ext(local_58,0);
      }
      in_stack_fffffffffffffef8 = G_cg;
      pCVar4 = CTcTokenizer::getcur(G_tok);
      in_stack_ffffffffffffff00 = CTcToken::get_text(pCVar4);
      pCVar4 = CTcTokenizer::getcur(G_tok);
      CTcToken::get_text_len(pCVar4);
      local_1c = CTcGenTarg::find_or_add_meta
                           (in_stack_fffffffffffffec8,(char *)in_stack_fffffffffffffec0,
                            CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                            (CTcSymMetaclass *)
                            CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
      pCVar5 = &CTcGenTarg::get_meta_sym(G_cg,local_1c)->super_CTcSymMetaclassBase;
      if (pCVar5 != local_58) {
        sVar6 = CTcSymbolBase::get_sym_len((CTcSymbolBase *)0x21b5a8);
        in_stack_fffffffffffffef4 = (uint)sVar6;
        pcVar7 = CTcSymbolBase::get_sym((CTcSymbolBase *)0x21b5b9);
        CTcTokenizer::log_error(0x2b9d,(ulong)in_stack_fffffffffffffef4,pcVar7);
      }
      CTcSymMetaclassBase::set_meta_idx(local_58,local_1c);
    }
    CTcTokenizer::next(in_stack_fffffffffffffea8);
  }
  else {
    CTcTokenizer::log_error_curtok
              (in_stack_fffffffffffffea0,(int)((ulong)in_stack_fffffffffffffe98 >> 0x20));
  }
  tVar1 = CTcTokenizer::cur((CTcTokenizer *)0x21b614);
  if (tVar1 == TOKT_COLON) {
    tVar1 = CTcTokenizer::next(in_stack_fffffffffffffea8);
    if (tVar1 == TOKT_SYM) {
      pCVar4 = CTcTokenizer::getcur(G_tok);
      CTcToken::get_text(pCVar4);
      pCVar4 = CTcTokenizer::getcur(G_tok);
      CTcToken::get_text_len(pCVar4);
      sc = (CTcSymMetaclass *)
           CTcPrsSymtab::find((CTcPrsSymtab *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                              0x21b6a3);
      if (sc == (CTcSymMetaclass *)0x0) {
        CTcTokenizer::log_error_curtok
                  (in_stack_fffffffffffffea0,(int)((ulong)in_stack_fffffffffffffe98 >> 0x20));
      }
      else {
        tVar2 = CTcSymbolBase::get_type((CTcSymbolBase *)sc);
        if (tVar2 == TC_SYM_METACLASS) {
          if (local_58 != (CTcSymMetaclassBase *)0x0) {
            CTcSymMetaclassBase::set_super_meta(local_58,sc);
          }
        }
        else {
          CTcTokenizer::log_error_curtok
                    (in_stack_fffffffffffffea0,(int)((ulong)in_stack_fffffffffffffe98 >> 0x20));
        }
      }
      CTcTokenizer::next(in_stack_fffffffffffffea8);
    }
    else {
      CTcTokenizer::log_error_curtok
                (in_stack_fffffffffffffea0,(int)((ulong)in_stack_fffffffffffffe98 >> 0x20));
    }
  }
  tVar1 = CTcTokenizer::cur((CTcTokenizer *)0x21b738);
  if (tVar1 == TOKT_LBRACE) {
    CTcTokenizer::next(in_stack_fffffffffffffea8);
  }
  else {
    CTcTokenizer::log_error_curtok
              (in_stack_fffffffffffffea0,(int)((ulong)in_stack_fffffffffffffe98 >> 0x20));
  }
  local_20 = 0;
LAB_0021b76d:
  do {
    if (local_20 != 0) {
      return (CTPNStmTop *)0x0;
    }
    CTcToken::CTcToken((CTcToken *)(local_c0 + 0x20));
    local_c0._28_4_ = 0;
    tVar1 = CTcTokenizer::cur((CTcTokenizer *)0x21b7aa);
    if (tVar1 == TOKT_EOF) {
      CTcTokenizer::log_error(0x2b71);
      *(int *)local_18 = 1;
      return (CTPNStmTop *)0x0;
    }
    if (tVar1 != TOKT_SYM) {
      if (tVar1 == TOKT_RBRACE) {
        CTcTokenizer::next(in_stack_fffffffffffffea8);
        local_20 = 1;
        goto LAB_0021b76d;
      }
      if (tVar1 == TOKT_SEM) {
        CTcTokenizer::next(in_stack_fffffffffffffea8);
        goto LAB_0021b76d;
      }
      if (tVar1 != TOKT_STATIC) {
        CTcTokenizer::log_error_curtok
                  (in_stack_fffffffffffffea0,(int)((ulong)in_stack_fffffffffffffe98 >> 0x20));
        CTcTokenizer::next(in_stack_fffffffffffffea8);
        goto LAB_0021b76d;
      }
      local_c0._28_4_ = 1;
      tVar1 = CTcTokenizer::next(in_stack_fffffffffffffea8);
      if (tVar1 != TOKT_SYM) {
        CTcTokenizer::log_error(0x2b72);
        goto LAB_0021b76d;
      }
    }
    pCVar4 = CTcTokenizer::copycur
                       ((CTcTokenizer *)
                        CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    memcpy(local_c0 + 0x20,pCVar4,0x21);
    if (local_58 != (CTcSymMetaclassBase *)0x0) {
      CTcToken::get_text((CTcToken *)(local_c0 + 0x20));
      CTcToken::get_text_len((CTcToken *)(local_c0 + 0x20));
      CTcSymMetaclassBase::add_prop
                (in_stack_ffffffffffffff10,
                 (char *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                 (size_t)in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8,
                 in_stack_fffffffffffffef4);
    }
    CTcTokenizer::next(in_stack_fffffffffffffea8);
    tVar1 = CTcTokenizer::cur((CTcTokenizer *)0x21b911);
    if (tVar1 == TOKT_LPAR) {
      CTcTokenizer::next(in_stack_fffffffffffffea8);
      in_stack_fffffffffffffe98 = local_c0 + 0xc;
      in_stack_fffffffffffffea0 = (CTcTokenizer *)local_c0;
      in_stack_fffffffffffffeb8 = 0;
      in_stack_fffffffffffffea8 = local_18;
      parse_formal_list(in_stack_00000020,in_stack_0000001c,in_stack_00000018,in_stack_00000010,
                        in_stack_00000008,unaff_retaddr,in_stack_00000030,in_stack_00000038,
                        in_stack_00000040,in_stack_00000048,in_stack_00000050,in_stack_00000058);
      if (*(int *)local_18 != 0) {
        return (CTPNStmTop *)0x0;
      }
    }
    iVar3 = parse_req_sem();
    if (iVar3 != 0) {
      *(int *)local_18 = 1;
      return (CTPNStmTop *)0x0;
    }
  } while( true );
}

Assistant:

CTPNStmTop *CTcParser::parse_intrinsic_class(int *err)
{
    int meta_id;
    int list_done;
    int got_name_tok = FALSE;
    CTcToken meta_tok;
    CTcSymMetaclass *meta_sym = 0;
    
    /* skip the 'class' keyword and check the class name symbol */
    if (G_tok->next() == TOKT_SYM)
    {
        /* get the token */
        meta_tok = *G_tok->copycur();

        /* 
         *   See if it's defined yet.  If it was previously defined as an
         *   external metaclass, 
         */
        meta_sym = (CTcSymMetaclass *)global_symtab_->find(
            meta_tok.get_text(), meta_tok.get_text_len());
        if (meta_sym != 0
            && (meta_sym->get_type() != TC_SYM_METACLASS
                || !meta_sym->is_ext()))
        {
            /* duplicate definition - log an error and forget the symbol */
            G_tok->log_error_curtok(TCERR_REDEF_INTRINS_NAME);
            meta_sym = 0;
        }
        else
        {
            /* note that we successfully parsed the class name token */
            got_name_tok = TRUE;
        }

        /* move on to the next token */
        G_tok->next();
    }
    else
    {
        /* 
         *   note the error, then keep going, assuming the name was
         *   missing but that the rest is well-formed 
         */
        G_tok->log_error_curtok(TCERR_REQ_INTRINS_CLASS_NAME_SYM);
    }

    /* skip the name symbol, and check for the global name string */
    if (G_tok->cur() == TOKT_SSTR)
    {
        /* set up the definitions if we got a valid name token */
        if (got_name_tok)
        {
            /* if we don't already have a symbol table entry, create one */
            if (meta_sym == 0)
            {
                /* no prior symbol table entry - create it and add it */
                meta_sym = new CTcSymMetaclass(
                    meta_tok.get_text(), meta_tok.get_text_len(),
                    FALSE, 0, G_cg->new_obj_id());
                global_symtab_->add_entry(meta_sym);
            }
            else
            {
                /* 
                 *   we have a prior definition, which must have been an
                 *   external import from a symbol file; remove the external
                 *   attribute since we're actually defining it now
                 */
                meta_sym->set_ext(FALSE);
            }

            /* tell the code generator to add this metaclass */
            meta_id = G_cg->find_or_add_meta(
                G_tok->getcur()->get_text(), G_tok->getcur()->get_text_len(),
                meta_sym);

            /* 
             *   if the metaclass was already defined for another symbol,
             *   it's an error
             */
            CTcSymMetaclass *table_sym = G_cg->get_meta_sym(meta_id);
            if (table_sym != meta_sym)
                G_tok->log_error(TCERR_META_ALREADY_DEF,
                                 (int)table_sym->get_sym_len(),
                                 table_sym->get_sym());

            /* set the metaclass ID in the symbol */
            meta_sym->set_meta_idx(meta_id);
        }

        /* skip the name */
        G_tok->next();
    }
    else
    {
        /* 
         *   note the error, then keep going, assuming that the name was
         *   missing but that the rest is correctly formed 
         */
        G_tok->log_error_curtok(TCERR_REQ_INTRINS_CLASS_NAME);
    }

    /* check for the optional intrinsic superclass */
    if (G_tok->cur() == TOKT_COLON)
    {
        /* skip the colon and get the symbol */
        if (G_tok->next() != TOKT_SYM)
        {
            /* note the error, and just continue from here */
            G_tok->log_error_curtok(TCERR_REQ_INTRINS_SUPERCLASS_NAME);
        }
        else
        {
            /* look up the superclass in the global symbols */
            CTcSymMetaclass *sc_meta_sym =
                (CTcSymMetaclass *)global_symtab_->find(
                    G_tok->getcur()->get_text(),
                    G_tok->getcur()->get_text_len());

            /* make sure we found the symbol, and that it's a metaclass */
            if (sc_meta_sym == 0)
            {
                /* the intrinsic superclass is not defined */
                G_tok->log_error_curtok(TCERR_INTRINS_SUPERCLASS_UNDEF);
            }
            else if (sc_meta_sym->get_type() != TC_SYM_METACLASS)
            {
                /* this is not an intrinsic class */
                G_tok->log_error_curtok(TCERR_INTRINS_SUPERCLASS_NOT_INTRINS);
            }
            else
            {
                /* remember the supermetaclass */
                if (meta_sym != 0)
                    meta_sym->set_super_meta(sc_meta_sym);
            }

            /* we're done with the name token */
            G_tok->next();
        }
    }

    /* we need an open brace after that */
    if (G_tok->cur() == TOKT_LBRACE)
    {
        /* skip the brace */
        G_tok->next();
    }
    else
    {
        /* note the error, but keep going */
        G_tok->log_error_curtok(TCERR_REQ_INTRINS_CLASS_LBRACE);
    }

    /* keep going until we find the closing brace */
    for (list_done = FALSE ; !list_done ; )
    {
        CTcToken prop_tok;

        /* presume it won't be a 'static' property */
        int is_static = FALSE;

        /* check what we have */
        switch(G_tok->cur())
        {
        case TOKT_RBRACE:
            /* closing brace - skip it, and we're done */
            G_tok->next();
            list_done = TRUE;
            break;

        case TOKT_EOF:
            /* end of file - log an error */
            G_tok->log_error(TCERR_EOF_IN_INTRINS_CLASS);

            /* return failure */
            *err = TRUE;
            return 0;

        case TOKT_SEM:
            /* empty list element; skip it */
            G_tok->next();
            break;

        case TOKT_STATIC:
            /* note that we have a static property */
            is_static = TRUE;

            /* a symbol must follow */
            if (G_tok->next() != TOKT_SYM)
            {
                G_tok->log_error(TCERR_REQ_INTRINS_CLASS_PROP);
                break;
            }

            /* fall through to parse the rest of the property definition */

        case TOKT_SYM:
            /* remember the property name */
            prop_tok = *G_tok->copycur();

            /* add the property */
            if (meta_sym != 0)
                meta_sym->add_prop(prop_tok.get_text(),
                                   prop_tok.get_text_len(), 0, is_static);

            /* skip the property name symbol */
            G_tok->next();

            /* if there's a formal parameter list, parse it */
            if (G_tok->cur() == TOKT_LPAR)
            {
                int argc;
                int opt_argc;
                int varargs;
                int varargs_list;
                CTcSymLocal *varargs_list_local;

                /* skip the open paren */
                G_tok->next();
                
                /* parse the list, ignoring the symbols defined */
                parse_formal_list(TRUE, TRUE, &argc, &opt_argc, &varargs,
                                  &varargs_list, &varargs_list_local,
                                  err, 0, FALSE, 0);

                /* if a fatal error occurred, return failure */
                if (*err != 0)
                    return 0;
            }

            /* require a semicolon after the property definition */
            if (parse_req_sem())
            {
                *err = TRUE;
                return 0;
            }

            /* done with this function */
            break;

        default:
            /* anything else is an error */
            G_tok->log_error_curtok(TCERR_REQ_INTRINS_CLASS_PROP);

            /* skip the errant token and proceed */
            G_tok->next();
            break;
        }
    }

    /* 
     *   there's no node to return - a metaclass definition doesn't
     *   generate any code, but simply adds entries to the symbol table,
     *   which we've already done 
     */
    return 0;
}